

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

void grow_buffer_unsafe(jpeg *j)

{
  uint uVar1;
  int iVar2;
  
  while( true ) {
    uVar1 = 0;
    if (j->nomore == 0) {
      uVar1 = get8(&j->s);
    }
    if ((uVar1 == 0xff) && (iVar2 = get8(&j->s), iVar2 != 0)) break;
    iVar2 = j->code_bits;
    j->code_buffer = j->code_buffer << 8 | uVar1;
    j->code_bits = iVar2 + 8;
    if (0x10 < iVar2) {
      return;
    }
  }
  j->marker = (uchar)iVar2;
  j->nomore = 1;
  return;
}

Assistant:

static void grow_buffer_unsafe(jpeg *j)
{
   do {
      int b = j->nomore ? 0 : get8(&j->s);
      if (b == 0xff) {
         int c = get8(&j->s);
         if (c != 0) {
            j->marker = (unsigned char) c;
            j->nomore = 1;
            return;
         }
      }
      j->code_buffer = (j->code_buffer << 8) | b;
      j->code_bits += 8;
   } while (j->code_bits <= 24);
}